

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::util_check::test_method(util_check *this)

{
  int iVar1;
  unique_ptr<int,_std::default_delete<int>_> *puVar2;
  optional<int> *poVar3;
  char *pcVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  bool bVar6;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  int local_108;
  int nine;
  lazy_ostream local_100;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  bool result;
  _Head_base<0UL,_int_*,_false> local_b8;
  int *local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  undefined1 *local_98;
  int **local_90;
  int *local_88;
  char *local_80;
  char *local_78;
  assertion_result local_70;
  _Head_base<0UL,_int_*,_false> local_58;
  undefined1 local_50;
  undefined1 *local_48;
  int **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_head_impl = (int *)operator_new(4);
  *local_58._M_head_impl = 2;
  puVar2 = inline_assertion_check<true,std::unique_ptr<int,std::default_delete<int>>>
                     ((unique_ptr<int,_std::default_delete<int>_> *)&local_58,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                      ,0x61,"test_method","std::make_unique<int>(2)");
  local_b8._M_head_impl =
       (puVar2->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  (puVar2->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  if (local_58._M_head_impl != (int *)0x0) {
    operator_delete(local_58._M_head_impl,4);
  }
  puVar2 = inline_assertion_check<true,std::unique_ptr<int,std::default_delete<int>>const&>
                     ((unique_ptr<int,_std::default_delete<int>_> *)&local_b8,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                      ,99,"test_method","p_two");
  bVar6 = *(puVar2->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl == 2;
  local_58._M_head_impl._0_1_ = bVar6;
  inline_assertion_check<true,bool>
            ((bool *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
             ,100,"test_method","two == 2");
  local_58._M_head_impl._0_1_ = 1;
  inline_assertion_check<true,bool>
            ((bool *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
             ,0x65,"test_method","true");
  pcVar4 = "result";
  result = bVar6;
  inline_assertion_check<true,bool_const&>
            (&result,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
             ,0x68,"test_method","result");
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x70;
  file.m_begin = (iterator)&local_d0;
  msg.m_end = in_R9;
  msg.m_begin = pcVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  nine = 3;
  local_88 = inline_assertion_check<true,int>
                       (&nine,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                        ,0x70,"test_method","(Assert(x).test() ? 3 : 0)");
  local_b0 = &local_108;
  local_108 = 3;
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*local_88 == 3);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_78 = "";
  local_40 = &local_88;
  local_50 = 0;
  local_58._M_head_impl = (int *)&PTR__lazy_ostream_013ae248;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae248;
  local_98 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_100,1,2,REQUIRE,0xf73143,(size_t)&local_80,0x70,&local_58,"3",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_58._M_head_impl._0_5_ = 0x100000009;
  pcVar4 = "std::optional<int>{9}";
  poVar3 = inline_assertion_check<true,std::optional<int>>
                     ((optional<int> *)&local_58,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp"
                      ,0x74,"test_method","std::optional<int>{9}");
  iVar1 = (poVar3->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = &DAT_00000075;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pcVar4;
  nine = iVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_100.m_empty = false;
  local_100._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 9);
  local_108 = 9;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_78 = "";
  local_88 = &local_108;
  local_50 = 0;
  local_58._M_head_impl = (int *)&PTR__lazy_ostream_013ae248;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_88;
  local_b0 = &nine;
  local_a0 = 0;
  local_a8 = &PTR__lazy_ostream_013ae248;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_100,1,2,REQUIRE,0xe754bf,(size_t)&local_80,0x75,&local_58,"nine",
             &local_a8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if (local_b8._M_head_impl != (int *)0x0) {
    operator_delete(local_b8._M_head_impl,4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_check)
{
    // Check that Assert can forward
    const std::unique_ptr<int> p_two = Assert(std::make_unique<int>(2));
    // Check that Assert works on lvalues and rvalues
    const int two = *Assert(p_two);
    Assert(two == 2);
    Assert(true);
    // Check that Assume can be used as unary expression
    const bool result{Assume(two == 2)};
    Assert(result);

    // Check that Assert doesn't require copy/move
    NoCopyOrMove x{9};
    Assert(x).i += 3;
    Assert(x).test();

    // Check nested Asserts
    BOOST_CHECK_EQUAL(Assert((Assert(x).test() ? 3 : 0)), 3);

    // Check -Wdangling-gsl does not trigger when copying the int. (It would
    // trigger on "const int&")
    const int nine{*Assert(std::optional<int>{9})};
    BOOST_CHECK_EQUAL(9, nine);
}